

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__hdr_test_core(stbi__context *s,char *signature)

{
  byte *pbVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  
  cVar2 = *signature;
  if (cVar2 != '\0') {
    pbVar1 = s->img_buffer;
    pcVar4 = signature + 1;
    do {
      if (pbVar1 < s->img_buffer_end) {
LAB_00118e5d:
        s->img_buffer = pbVar1 + 1;
        uVar3 = (uint)*pbVar1;
        cVar2 = pcVar4[-1];
        pbVar1 = pbVar1 + 1;
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          pbVar1 = s->img_buffer;
          goto LAB_00118e5d;
        }
        uVar3 = 0;
      }
      if (uVar3 != (int)cVar2) {
        return 0;
      }
      cVar2 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar2 != '\0');
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return 1;
}

Assistant:

static int stbi__hdr_test_core(stbi__context *s, const char *signature)
{
   int i;
   for (i=0; signature[i]; ++i)
      if (stbi__get8(s) != signature[i])
          return 0;
   stbi__rewind(s);
   return 1;
}